

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O1

void __thiscall btMatrixX<float>::setIdentity(btMatrixX<float> *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  long lVar5;
  int iVar6;
  
  setZero(this);
  iVar1 = this->m_rows;
  lVar5 = (long)iVar1;
  if (0 < lVar5) {
    iVar2 = this->m_cols;
    iVar3 = this->m_setElemOperations;
    pfVar4 = (this->m_storage).m_data;
    iVar6 = 0;
    do {
      pfVar4[iVar6] = 1.0;
      iVar6 = iVar6 + iVar2 + 1;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    this->m_setElemOperations = iVar3 + iVar1;
  }
  return;
}

Assistant:

void setIdentity()
	{
		btAssert(rows() == cols());
		
		setZero();
		for (int row=0;row<rows();row++)
		{
			setElem(row,row,1);
		}
	}